

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O1

pin_id_t __thiscall lsim::ModelCircuit::port_by_name(ModelCircuit *this,char *name)

{
  const_iterator cVar1;
  pin_id_t pVar2;
  allocator local_31;
  key_type local_30;
  
  std::__cxx11::string::string((string *)&local_30,name,&local_31);
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_ports_lut)._M_h,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    pVar2 = 0xffffffffffffffff;
  }
  else {
    pVar2 = *(pin_id_t *)
             ((long)cVar1.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                    ._M_cur + 0x28);
  }
  return pVar2;
}

Assistant:

pin_id_t ModelCircuit::port_by_name(const char *name) const {
    auto found = m_ports_lut.find(name);
    if (found == m_ports_lut.end()) {
        return PIN_ID_INVALID;
    }

    return found->second;
}